

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_effectiveness.cpp
# Opt level: O0

void run<ANSfold<5u>>(vector<unsigned_int,_std::allocator<unsigned_int>_> *input,string *input_name)

{
  undefined1 auVar1 [16];
  unsigned_long *puVar2;
  size_type sVar3;
  undefined8 uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  undefined8 extraout_XMM0_Qa;
  double dVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar9 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_01 [56];
  double enc_ns_per_int;
  double encode_IPS;
  double BPI;
  type encoding_time_ns;
  time_point stop_encode;
  time_point start_encode;
  int i;
  size_t encoding_time_ns_min;
  size_t encoded_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_data;
  type *sigma;
  type_conflict *input_entropy;
  size_t in_stack_fffffffffffffe98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffea0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffea8;
  type in_stack_fffffffffffffeb0;
  size_type in_stack_fffffffffffffeb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffec0;
  string local_f0 [32];
  double local_d0;
  double local_c8;
  double local_c0;
  unsigned_long local_b8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  int local_94;
  unsigned_long local_90;
  size_t local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  type *local_30;
  type_conflict *local_28;
  pair<double,_unsigned_long> local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  undefined1 extraout_var_00 [56];
  
  auVar8 = in_ZMM0._8_56_;
  local_8 = in_RDI;
  local_20 = compute_entropy(in_stack_fffffffffffffea0);
  auVar6._0_8_ = local_20.first;
  auVar6._8_56_ = auVar8;
  local_28 = std::get<0ul,double,unsigned_long>((pair<double,_unsigned_long> *)0x18e4e7);
  local_30 = std::get<1ul,double,unsigned_long>((pair<double,_unsigned_long> *)0x18e4f9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x18e529);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (allocator_type *)in_stack_fffffffffffffeb0.__r);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x18e54f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x18e577);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (allocator_type *)in_stack_fffffffffffffeb0.__r);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x18e59d);
  local_90 = std::numeric_limits<unsigned_long>::max();
  for (local_94 = 0; auVar9 = in_ZMM1._0_16_, local_94 < 1; local_94 = local_94 + 1) {
    local_a0 = std::chrono::_V2::system_clock::now();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x18e5dd);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
    this = &local_48;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x18e606);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x18e627);
    local_88 = ANSfold<5U>::encode((uint32_t *)in_stack_fffffffffffffeb0.__r,
                                   (size_t)in_stack_fffffffffffffea8,
                                   (uint8_t *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                   (uint8_t *)0x18e643);
    local_a8 = std::chrono::_V2::system_clock::now();
    in_ZMM1._8_56_ = extraout_var_01;
    in_ZMM1._0_8_ = extraout_XMM1_Qa;
    auVar6._8_56_ = extraout_var;
    auVar6._0_8_ = (double)extraout_XMM0_Qa;
    in_stack_fffffffffffffeb0 =
         std::chrono::operator-
                   (in_stack_fffffffffffffea8,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffffea0);
    local_b0.__r = in_stack_fffffffffffffeb0.__r;
    local_b8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_b0);
    puVar2 = std::min<unsigned_long>(&local_b8,&local_90);
    local_90 = *puVar2;
  }
  auVar1 = vcvtusi2sd_avx512f(auVar6._0_16_,local_88 << 3);
  dVar5 = auVar1._0_8_;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  auVar9 = vcvtusi2sd_avx512f(auVar9,sVar3);
  local_c0 = dVar5 / auVar9._0_8_;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  auVar7._0_8_ = compute_ips(sVar3,local_90);
  auVar7._8_56_ = extraout_var_00;
  auVar1 = vcvtusi2sd_avx512f(auVar7._0_16_,local_90);
  dVar5 = auVar1._0_8_;
  local_c8 = auVar7._0_8_;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  auVar9 = vcvtusi2sd_avx512f(auVar9,sVar3);
  local_d0 = dVar5 / auVar9._0_8_;
  ANSfold<5u>::name_abi_cxx11_();
  uVar4 = std::__cxx11::string::c_str();
  printf("(%s,%2.4f)\n",local_c0,uVar4);
  std::__cxx11::string::~string(local_f0);
  fflush(_stdout);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0.__r)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffeb0.__r)
  ;
  return;
}

Assistant:

void run(std::vector<uint32_t>& input, std::string input_name)
{
    // (0) compute entropy
    auto [input_entropy, sigma] = compute_entropy(input);

    // (1) encode
    std::vector<uint8_t> encoded_data(input.size() * 8);
    std::vector<uint8_t> tmp_buf(input.size() * 8);

    size_t encoded_bytes;
    size_t encoding_time_ns_min = std::numeric_limits<size_t>::max();
    for (int i = 0; i < NUM_RUNS; i++) {
        auto start_encode = std::chrono::high_resolution_clock::now();
        encoded_bytes = t_compressor::encode(input.data(), input.size(),
            encoded_data.data(), encoded_data.size(), tmp_buf.data());
        auto stop_encode = std::chrono::high_resolution_clock::now();
        auto encoding_time_ns = stop_encode - start_encode;
        encoding_time_ns_min
            = std::min((size_t)encoding_time_ns.count(), encoding_time_ns_min);
    }

    double BPI = double(encoded_bytes * 8) / double(input.size());
    double encode_IPS = compute_ips(input.size(), encoding_time_ns_min);
    double enc_ns_per_int = double(encoding_time_ns_min) / double(input.size());

    // (4) output stats
    printf("(%s,%2.4f)\n", t_compressor::name().c_str(), BPI);
    fflush(stdout);
}